

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobVerificationManager.cxx
# Opt level: O2

vector<cmGlobCacheEntry,_std::allocator<cmGlobCacheEntry>_> * __thiscall
cmGlobVerificationManager::GetCacheEntries
          (vector<cmGlobCacheEntry,_std::allocator<cmGlobCacheEntry>_> *__return_storage_ptr__,
          cmGlobVerificationManager *this)

{
  _Base_ptr p_Var1;
  CacheEntryKey k;
  CacheEntryValue v;
  CacheEntryKey local_b0;
  CacheEntryValue local_68;
  
  (__return_storage_ptr__->super__Vector_base<cmGlobCacheEntry,_std::allocator<cmGlobCacheEntry>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cmGlobCacheEntry,_std::allocator<cmGlobCacheEntry>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cmGlobCacheEntry,_std::allocator<cmGlobCacheEntry>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var1 = (this->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->Cache)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    CacheEntryKey::CacheEntryKey(&local_b0,(CacheEntryKey *)(p_Var1 + 1));
    CacheEntryValue::CacheEntryValue(&local_68,(CacheEntryValue *)&p_Var1[3]._M_parent);
    if (local_68.Initialized == true) {
      std::vector<cmGlobCacheEntry,std::allocator<cmGlobCacheEntry>>::
      emplace_back<bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                ((vector<cmGlobCacheEntry,std::allocator<cmGlobCacheEntry>> *)__return_storage_ptr__
                 ,&local_b0.Recurse,&local_b0.ListDirectories,&local_b0.FollowSymlinks,
                 &local_b0.Relative,&local_b0.Expression,&local_68.Files);
    }
    CacheEntryValue::~CacheEntryValue(&local_68);
    CacheEntryKey::~CacheEntryKey(&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmGlobCacheEntry> cmGlobVerificationManager::GetCacheEntries()
  const
{
  std::vector<cmGlobCacheEntry> entries;
  for (auto const& i : this->Cache) {
    CacheEntryKey k = std::get<0>(i);
    CacheEntryValue v = std::get<1>(i);
    if (v.Initialized) {
      entries.emplace_back(k.Recurse, k.ListDirectories, k.FollowSymlinks,
                           k.Relative, k.Expression, v.Files);
    }
  }
  return entries;
}